

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_twod_orientation(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  REF_INT cell;
  char *pcVar9;
  ulong uVar10;
  REF_BOOL valid;
  REF_BOOL *local_b8;
  REF_NODE local_b0;
  REF_INT nodes [27];
  
  local_b0 = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar10 = 0xffffffff;
  cell = -1;
  local_b8 = allowed;
  if (-1 < remove) {
    pRVar1 = ref_cell->ref_adj;
    uVar10 = 0xffffffff;
    cell = -1;
    if (remove < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)remove];
      uVar10 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar10 = (ulong)uVar4;
      }
    }
  }
  while( true ) {
    if ((int)uVar10 == -1) {
      *local_b8 = 1;
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar4 = ref_cell->node_per;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    bVar3 = false;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[uVar5] == keep) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        if (nodes[lVar6] == remove) {
          nodes[lVar6] = keep;
        }
      }
      uVar4 = ref_node_tri_twod_orientation(local_b0,nodes,&valid);
      if (uVar4 != 0) {
        pcVar9 = "valid";
        uVar8 = 0x438;
        goto LAB_001add7f;
      }
      if (valid == 0) {
        return 0;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar10 = (ulong)pRVar2[(int)uVar10].next;
    cell = -1;
    if (uVar10 != 0xffffffffffffffff) {
      cell = pRVar2[uVar10].ref;
    }
  }
  pcVar9 = "nodes";
  uVar8 = 0x428;
LAB_001add7f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar8,
         "ref_collapse_edge_twod_orientation",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_twod_orientation(REF_GRID ref_grid,
                                                      REF_INT keep,
                                                      REF_INT remove,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed, valid;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (keep == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (remove == nodes[node]) {
        nodes[node] = keep;
      }
    }

    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}